

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void nn_append_string(nn_parse_context *ctx,nn_option *opt,char *str)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  ushort **ppuVar4;
  ulong uVar5;
  FILE *__stream;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar6;
  void *pvVar7;
  
  pvVar7 = ctx->target;
  lVar6 = (long)opt->offset;
  if (*(void **)((long)pvVar7 + lVar6) == (void *)0x0) {
    pvVar2 = malloc(8);
    *(undefined4 *)((long)pvVar7 + lVar6 + 0x10) = 1;
  }
  else {
    iVar1 = *(int *)((long)pvVar7 + lVar6 + 0x10);
    *(int *)((long)pvVar7 + lVar6 + 0x10) = iVar1 + 1;
    opt = (nn_option *)((long)iVar1 * 8 + 8);
    pvVar2 = realloc(*(void **)((long)pvVar7 + lVar6),(size_t)opt);
  }
  *(void **)((long)pvVar7 + lVar6) = pvVar2;
  if (pvVar2 == (void *)0x0) {
    __stream = (FILE *)ctx;
    nn_memory_error(ctx);
    sVar3 = strlen((char *)opt);
    if (0x37 < sVar3) {
      ppuVar4 = __ctype_b_loc();
      for (uVar5 = 0x38; 1 < (uint)uVar5; uVar5 = (ulong)((uint)uVar5 - 1)) {
        if ((*(byte *)((long)*ppuVar4 + (long)*(char *)((long)&opt->longname + uVar5) * 2 + 1) &
            0x20) != 0) {
          fprintf(__stream,"%.*s",uVar5,opt,in_R8,in_R9,str,ctx,pvVar7);
          return;
        }
      }
    }
    fputs((char *)opt,__stream);
    return;
  }
  *(char **)((long)pvVar2 + (long)*(int *)((long)pvVar7 + lVar6 + 0x10) * 8 + -8) = str;
  return;
}

Assistant:

static void nn_append_string (struct nn_parse_context *ctx,
                             struct nn_option *opt, char *str)
{
    struct nn_string_list *lst;

    lst = (struct nn_string_list *)(
        ((char *)ctx->target) + opt->offset);
    if (lst->items) {
        lst->num += 1;
        lst->items = realloc (lst->items, sizeof (char *) * lst->num);
    } else {
        lst->items = malloc (sizeof (char *));
        lst->num = 1;
    }
    if (!lst->items) {
        nn_memory_error (ctx);
    }
    lst->items[lst->num-1] = str;
}